

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O3

void __thiscall
vkt::sr::anon_unknown_0::LinearDerivateUniformSetup::setup
          (LinearDerivateUniformSetup *this,ShaderRenderCaseInstance *instance,Vec4 *constCoords)

{
  BaseUniformType type;
  
  DerivateUniformSetup::setup(&this->super_DerivateUniformSetup,instance,constCoords);
  type = *(BaseUniformType *)&(this->super_DerivateUniformSetup).field_0x14;
  if ((type < UI_THREE) && ((0x62U >> (type & UI4_TWO) & 1) != 0)) {
    ShaderRenderCaseInstance::useUniform(instance,2,type);
    return;
  }
  return;
}

Assistant:

void LinearDerivateUniformSetup::setup (ShaderRenderCaseInstance& instance, const tcu::Vec4& constCoords) const
{
	DerivateUniformSetup::setup(instance, constCoords);

	if (m_usedDefaultUniform != U_LAST)
		switch (m_usedDefaultUniform)
		{
			case UB_TRUE:
			case UI_ONE:
			case UI_TWO:
				instance.useUniform(2u, m_usedDefaultUniform);
				break;
			default:
				DE_ASSERT(false);
				break;
		}
}